

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Glucose::SimpSolver::extendModel(SimpSolver *this)

{
  vec<Glucose::lbool> *this_00;
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  
  this_00 = &(this->super_Solver).model;
  if ((this->super_Solver).model.sz == 0) {
    vec<Glucose::lbool>::growTo(this_00,(this->super_Solver).vardata.sz);
  }
  iVar4 = (this->elimclauses).sz;
  if (1 < iVar4) {
    uVar3 = iVar4 - 1;
    do {
      puVar1 = (this->elimclauses).data;
      uVar5 = puVar1[uVar3];
      iVar4 = uVar3 - 1;
      if (1 < (int)uVar5) {
        puVar6 = puVar1 + iVar4;
        do {
          if (((byte)*puVar6 & 1 ^ this_00->data[(int)*puVar6 >> 1].value) != 1) goto LAB_001155e8;
          iVar4 = iVar4 + -1;
          puVar6 = puVar6 + -1;
          bVar2 = 2 < (int)uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar2);
        uVar5 = 1;
      }
      this_00->data[(int)puVar1[iVar4] >> 1].value = (byte)puVar1[iVar4] & 1;
LAB_001155e8:
      uVar3 = iVar4 - uVar5;
    } while (uVar3 != 0 && (int)uVar5 <= iVar4);
  }
  return;
}

Assistant:

void SimpSolver::extendModel()
{
    int i, j;
    Lit x;

    if(model.size()==0) model.growTo(nVars());

    for (i = elimclauses.size()-1; i > 0; i -= j){
        for (j = elimclauses[i--]; j > 1; j--, i--)
            if (modelValue(toLit(elimclauses[i])) != l_False)
                goto next;

        x = toLit(elimclauses[i]);
        model[var(x)] = lbool(!sign(x));
    next:;
    }
}